

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 VmJsonDecode(json_decoder *pDecoder,jx9_value *pArrayKey)

{
  uint uVar1;
  ProcJSONConsumer p_Var2;
  void *pvVar3;
  SyToken *pSVar4;
  sxi32 sVar5;
  int iVar6;
  jx9_value *pObj;
  jx9_value *pVal;
  SyToken *pSVar7;
  SyToken *pSVar8;
  SyToken *pSVar9;
  anon_union_8_3_18420de5_for_x aVar10;
  bool bVar11;
  
  if (0x1f < pDecoder->rec_count) {
    return -10;
  }
  pSVar8 = pDecoder->pIn;
  uVar1 = pSVar8->nType;
  if ((uVar1 & 0x81f) == 0) {
    if ((char)uVar1 < '\0') {
      pDecoder->pIn = pSVar8 + 1;
      pObj = jx9_context_new_array(pDecoder->pCtx);
      if (pObj == (jx9_value *)0x0) goto LAB_0012d2d9;
      p_Var2 = pDecoder->xConsumer;
      pvVar3 = pDecoder->pUserData;
      pDecoder->xConsumer = VmJsonArrayDecoder;
      pDecoder->pUserData = pObj;
      pSVar8 = pDecoder->pEnd;
      pSVar7 = pDecoder->pIn;
      while (bVar11 = pSVar7 < pSVar8, bVar11) {
        pSVar9 = pSVar7;
        if ((pSVar7->nType & 0x400) != 0) {
          do {
            pSVar7 = pSVar9 + 1;
            bVar11 = pSVar7 < pSVar8;
            if (!bVar11) goto LAB_0012d35a;
            pSVar4 = pSVar9 + 1;
            pSVar9 = pSVar7;
          } while ((pSVar4->nType & 0x400) != 0);
          pDecoder->pIn = pSVar7;
        }
        if (!bVar11) break;
        if ((pSVar7->nType & 0x100) != 0) {
          if (bVar11) {
            pSVar7 = pSVar7 + 1;
LAB_0012d35a:
            pDecoder->pIn = pSVar7;
          }
          break;
        }
        pDecoder->rec_count = pDecoder->rec_count + 1;
        sVar5 = VmJsonDecode(pDecoder,(jx9_value *)0x0);
        pDecoder->rec_count = pDecoder->rec_count + -1;
        if (sVar5 == -10) {
          return -10;
        }
        if ((pDecoder->pIn < pDecoder->pEnd) && ((pDecoder->pIn->nType & 0x500) == 0))
        goto LAB_0012d345;
        pSVar8 = pDecoder->pEnd;
        pSVar7 = pDecoder->pIn;
      }
      pDecoder->xConsumer = p_Var2;
      pDecoder->pUserData = pvVar3;
      (*p_Var2)(pDecoder->pCtx,pArrayKey,pObj,pvVar3);
    }
    else {
      if ((uVar1 & 0x20) == 0) {
        return -10;
      }
      pDecoder->pIn = pSVar8 + 1;
      pObj = jx9_context_new_array(pDecoder->pCtx);
      pVal = jx9_context_new_scalar(pDecoder->pCtx);
      if (pVal == (jx9_value *)0x0 || pObj == (jx9_value *)0x0) {
LAB_0012d2d9:
        jx9VmThrowError(pDecoder->pCtx->pVm,&pDecoder->pCtx->pFunc->sName,1,
                        "JX9 is running out of memory");
        return -10;
      }
      p_Var2 = pDecoder->xConsumer;
      pvVar3 = pDecoder->pUserData;
      pDecoder->xConsumer = VmJsonArrayDecoder;
      pDecoder->pUserData = pObj;
      pSVar7 = pDecoder->pEnd;
      pSVar8 = pDecoder->pIn;
      bVar11 = pSVar8 < pSVar7;
      if (bVar11) {
        do {
          pSVar9 = pSVar8;
          if ((pSVar8->nType & 0x400) != 0) {
            do {
              pSVar8 = pSVar9 + 1;
              bVar11 = pSVar8 < pSVar7;
              if (!bVar11) goto LAB_0012d380;
              pSVar4 = pSVar9 + 1;
              pSVar9 = pSVar8;
            } while ((pSVar4->nType & 0x400) != 0);
            pDecoder->pIn = pSVar8;
          }
          if (!bVar11) break;
          uVar1 = pSVar8->nType;
          if ((uVar1 & 0x40) != 0) {
            if (bVar11) {
              pSVar8 = pSVar8 + 1;
LAB_0012d380:
              pDecoder->pIn = pSVar8;
            }
            break;
          }
          if ((((uVar1 & 0x804) == 0) || (pSVar7 <= pSVar8 + 1)) || ((pSVar8[1].nType & 0x200) == 0)
             ) {
LAB_0012d345:
            *pDecoder->pErr = -0xc;
            return -10;
          }
          if ((uVar1 >> 0xb & 1) == 0) {
            VmJsonDequoteString(&pSVar8->sData,pVal);
          }
          else {
            jx9_value_string(pVal,(pSVar8->sData).zString,(pSVar8->sData).nByte);
          }
          pDecoder->pIn = pDecoder->pIn + 2;
          pDecoder->rec_count = pDecoder->rec_count + 1;
          sVar5 = VmJsonDecode(pDecoder,pVal);
          pDecoder->rec_count = pDecoder->rec_count + -1;
          if (sVar5 == -10) {
            return -10;
          }
          (pVal->sBlob).nByte = 0;
          uVar1 = (pVal->sBlob).nFlags;
          if ((uVar1 & 4) != 0) {
            (pVal->sBlob).pBlob = (void *)0x0;
            (pVal->sBlob).mByte = 0;
            (pVal->sBlob).nFlags = uVar1 & 0xfffffffb;
          }
          pSVar8 = pDecoder->pIn;
          pSVar7 = pDecoder->pEnd;
          bVar11 = pSVar8 < pSVar7;
        } while (bVar11);
      }
      pDecoder->xConsumer = p_Var2;
      pDecoder->pUserData = pvVar3;
      (*p_Var2)(pDecoder->pCtx,pArrayKey,pObj,pvVar3);
      jx9_context_release_value(pDecoder->pCtx,pVal);
    }
  }
  else {
    pObj = jx9_context_new_scalar(pDecoder->pCtx);
    if (pObj == (jx9_value *)0x0) goto LAB_0012d2d9;
    pSVar8 = pDecoder->pIn;
    uVar1 = pSVar8->nType;
    if ((uVar1 & 8) == 0) {
      if ((uVar1 & 3) == 0) {
        if ((uVar1 & 0x10) == 0) {
          if ((uVar1 >> 0xb & 1) == 0) {
            VmJsonDequoteString(&pSVar8->sData,pObj);
          }
          else {
            jx9_value_string(pObj,(pSVar8->sData).zString,(pSVar8->sData).nByte);
          }
        }
        else {
          jx9_value_string(pObj,(pSVar8->sData).zString,(pSVar8->sData).nByte);
          jx9MemObjToNumeric(pObj);
        }
      }
      else {
        aVar10._0_4_ = uVar1 & 1;
        aVar10.iVal._4_4_ = 0;
        jx9MemObjRelease(pObj);
        pObj->x = aVar10;
        pObj->iFlags = pObj->iFlags & 0xfffffe90U | 8;
      }
    }
    else {
      jx9MemObjRelease(pObj);
    }
    iVar6 = (*pDecoder->xConsumer)(pDecoder->pCtx,pArrayKey,pObj,pDecoder->pUserData);
    if (iVar6 == -10) {
      return -10;
    }
    pDecoder->pIn = pDecoder->pIn + 1;
  }
  jx9_context_release_value(pDecoder->pCtx,pObj);
  return 0;
}

Assistant:

static sxi32 VmJsonDecode(
	json_decoder *pDecoder, /* JSON decoder */      
	jx9_value *pArrayKey    /* Key for the decoded array */
	){
	jx9_value *pWorker; /* Worker variable */
	sxi32 rc;
	/* Check if we do not nest to much */
	if( pDecoder->rec_count > 31 ){
		/* Nesting limit reached, abort decoding immediately */
		return SXERR_ABORT;
	}
	if( pDecoder->pIn->nType & (JSON_TK_STR|JSON_TK_ID|JSON_TK_TRUE|JSON_TK_FALSE|JSON_TK_NULL|JSON_TK_NUM) ){
		/* Scalar value */
		pWorker = jx9_context_new_scalar(pDecoder->pCtx);
		if( pWorker == 0 ){
			jx9_context_throw_error(pDecoder->pCtx, JX9_CTX_ERR, "JX9 is running out of memory");
			/* Abort the decoding operation immediately */
			return SXERR_ABORT;
		}
		/* Reflect the JSON image */
		if( pDecoder->pIn->nType & JSON_TK_NULL ){
			/* Nullify the value.*/
			jx9_value_null(pWorker);
		}else if( pDecoder->pIn->nType & (JSON_TK_TRUE|JSON_TK_FALSE) ){
			/* Boolean value */
			jx9_value_bool(pWorker, (pDecoder->pIn->nType & JSON_TK_TRUE) ? 1 : 0 );
		}else if( pDecoder->pIn->nType & JSON_TK_NUM ){
			SyString *pStr = &pDecoder->pIn->sData;
			/* 
			 * Numeric value.
			 * Get a string representation first then try to get a numeric
			 * value.
			 */
			jx9_value_string(pWorker, pStr->zString, (int)pStr->nByte);
			/* Obtain a numeric representation */
			jx9MemObjToNumeric(pWorker);
		}else if( pDecoder->pIn->nType & JSON_TK_ID ){
			SyString *pStr = &pDecoder->pIn->sData;
			jx9_value_string(pWorker, pStr->zString, (int)pStr->nByte);
		}else{
			/* Dequote the string */
			VmJsonDequoteString(&pDecoder->pIn->sData, pWorker);
		}
		/* Invoke the consumer callback */
		rc = pDecoder->xConsumer(pDecoder->pCtx, pArrayKey, pWorker, pDecoder->pUserData);
		if( rc == SXERR_ABORT ){
			return SXERR_ABORT;
		}
		/* All done, advance the stream cursor */
		pDecoder->pIn++;
	}else if( pDecoder->pIn->nType & JSON_TK_OSB /*'[' */) {
		ProcJSONConsumer xOld;
		void *pOld;
		/* Array representation*/
		pDecoder->pIn++;
		/* Create a working array */
		pWorker = jx9_context_new_array(pDecoder->pCtx);
		if( pWorker == 0 ){
			jx9_context_throw_error(pDecoder->pCtx, JX9_CTX_ERR, "JX9 is running out of memory");
			/* Abort the decoding operation immediately */
			return SXERR_ABORT;
		}
		/* Save the old consumer */
		xOld = pDecoder->xConsumer;
		pOld = pDecoder->pUserData;
		/* Set the new consumer */
		pDecoder->xConsumer = VmJsonArrayDecoder;
		pDecoder->pUserData = pWorker;
		/* Decode the array */
		for(;;){
			/* Jump trailing comma. Note that the standard JX9 engine will not let you
			 * do this.
			 */
			while( (pDecoder->pIn < pDecoder->pEnd) && (pDecoder->pIn->nType & JSON_TK_COMMA) ){
				pDecoder->pIn++;
			}
			if( pDecoder->pIn >= pDecoder->pEnd || (pDecoder->pIn->nType & JSON_TK_CSB) /*']'*/ ){
				if( pDecoder->pIn < pDecoder->pEnd ){
					pDecoder->pIn++; /* Jump the trailing ']' */
				}
				break;
			}
			/* Recurse and decode the entry */
			pDecoder->rec_count++;
			rc = VmJsonDecode(pDecoder, 0);
			pDecoder->rec_count--;
			if( rc == SXERR_ABORT ){
				/* Abort processing immediately */
				return SXERR_ABORT;
			}
			/*The cursor is automatically advanced by the VmJsonDecode() function */
			if( (pDecoder->pIn < pDecoder->pEnd) &&
				((pDecoder->pIn->nType & (JSON_TK_CSB/*']'*/|JSON_TK_COMMA/*','*/))==0) ){
					/* Unexpected token, abort immediatley */
					*pDecoder->pErr = SXERR_SYNTAX;
					return SXERR_ABORT;
			}
		}
		/* Restore the old consumer */
		pDecoder->xConsumer = xOld;
		pDecoder->pUserData = pOld;
		/* Invoke the old consumer on the decoded array */
		xOld(pDecoder->pCtx, pArrayKey, pWorker, pOld);
	}else if( pDecoder->pIn->nType & JSON_TK_OCB /*'{' */) {
		ProcJSONConsumer xOld;
		jx9_value *pKey;
		void *pOld;
		/* Object representation*/
		pDecoder->pIn++;
		/* Create a working array */
		pWorker = jx9_context_new_array(pDecoder->pCtx);
		pKey = jx9_context_new_scalar(pDecoder->pCtx);
		if( pWorker == 0 || pKey == 0){
			jx9_context_throw_error(pDecoder->pCtx, JX9_CTX_ERR, "JX9 is running out of memory");
			/* Abort the decoding operation immediately */
			return SXERR_ABORT;
		}
		/* Save the old consumer */
		xOld = pDecoder->xConsumer;
		pOld = pDecoder->pUserData;
		/* Set the new consumer */
		pDecoder->xConsumer = VmJsonArrayDecoder;
		pDecoder->pUserData = pWorker;
		/* Decode the object */
		for(;;){
			/* Jump trailing comma. Note that the standard JX9 engine will not let you
			 * do this.
			 */
			while( (pDecoder->pIn < pDecoder->pEnd) && (pDecoder->pIn->nType & JSON_TK_COMMA) ){
				pDecoder->pIn++;
			}
			if( pDecoder->pIn >= pDecoder->pEnd || (pDecoder->pIn->nType & JSON_TK_CCB) /*'}'*/ ){
				if( pDecoder->pIn < pDecoder->pEnd ){
					pDecoder->pIn++; /* Jump the trailing ']' */
				}
				break;
			}
			if( (pDecoder->pIn->nType & (JSON_TK_ID|JSON_TK_STR)) == 0 || &pDecoder->pIn[1] >= pDecoder->pEnd
				|| (pDecoder->pIn[1].nType & JSON_TK_COLON) == 0){
					/* Syntax error, return immediately */
					*pDecoder->pErr = SXERR_SYNTAX;
					return SXERR_ABORT;
			}
			if( pDecoder->pIn->nType & JSON_TK_ID ){
				SyString *pStr = &pDecoder->pIn->sData;
				jx9_value_string(pKey, pStr->zString, (int)pStr->nByte);
			}else{
				/* Dequote the key */
				VmJsonDequoteString(&pDecoder->pIn->sData, pKey);
			}
			/* Jump the key and the colon */
			pDecoder->pIn += 2; 
			/* Recurse and decode the value */
			pDecoder->rec_count++;
			rc = VmJsonDecode(pDecoder, pKey);
			pDecoder->rec_count--;
			if( rc == SXERR_ABORT ){
				/* Abort processing immediately */
				return SXERR_ABORT;
			}
			/* Reset the internal buffer of the key */
			jx9_value_reset_string_cursor(pKey);
			/*The cursor is automatically advanced by the VmJsonDecode() function */
		}
		/* Restore the old consumer */
		pDecoder->xConsumer = xOld;
		pDecoder->pUserData = pOld;
		/* Invoke the old consumer on the decoded object*/
		xOld(pDecoder->pCtx, pArrayKey, pWorker, pOld);
		/* Release the key */
		jx9_context_release_value(pDecoder->pCtx, pKey);
	}else{
		/* Unexpected token */
		return SXERR_ABORT; /* Abort immediately */
	}
	/* Release the worker variable */
	jx9_context_release_value(pDecoder->pCtx, pWorker);
	return SXRET_OK;
}